

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O2

bool absl::lts_20240722::flags_internal::AbslParseFlag(string_view text,bool *dst,string *param_3)

{
  char *pcVar1;
  ulong uVar2;
  char cVar3;
  bool bVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  string_view sVar8;
  
  sVar8 = StripAsciiWhitespace(text);
  lVar7 = 0;
  uVar2 = 0;
  do {
    uVar6 = uVar2;
    if (uVar6 == 5) goto LAB_001078d9;
    pcVar1 = *(char **)((long)&PTR_anon_var_dwarf_39_0010cc80 + lVar7);
    sVar5 = strlen(pcVar1);
    cVar3 = absl::lts_20240722::EqualsIgnoreCase(sVar8._M_len,sVar8._M_str,sVar5,pcVar1);
    if (cVar3 != '\0') {
      bVar4 = true;
      goto LAB_001078d3;
    }
    pcVar1 = *(char **)((long)&PTR_anon_var_dwarf_9c_0010ccb0 + lVar7);
    sVar5 = strlen(pcVar1);
    cVar3 = absl::lts_20240722::EqualsIgnoreCase(sVar8._M_len,sVar8._M_str,sVar5,pcVar1);
    lVar7 = lVar7 + 8;
    uVar2 = uVar6 + 1;
  } while (cVar3 == '\0');
  bVar4 = false;
LAB_001078d3:
  *dst = bVar4;
LAB_001078d9:
  return uVar6 < 5;
}

Assistant:

bool AbslParseFlag(absl::string_view text, bool* dst, std::string*) {
  const char* kTrue[] = {"1", "t", "true", "y", "yes"};
  const char* kFalse[] = {"0", "f", "false", "n", "no"};
  static_assert(sizeof(kTrue) == sizeof(kFalse), "true_false_equal");

  text = absl::StripAsciiWhitespace(text);

  for (size_t i = 0; i < ABSL_ARRAYSIZE(kTrue); ++i) {
    if (absl::EqualsIgnoreCase(text, kTrue[i])) {
      *dst = true;
      return true;
    } else if (absl::EqualsIgnoreCase(text, kFalse[i])) {
      *dst = false;
      return true;
    }
  }
  return false;  // didn't match a legal input
}